

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

obx_qb_cond __thiscall
obx::anon_unknown_3::QCGroup::applyTo(QCGroup *this,OBX_query_builder *cqb,bool isRoot)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  obx_qb_cond oVar4;
  long lVar5;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> *cond;
  pointer psVar6;
  vector<int,_std::allocator<int>_> cond_ids;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  psVar6 = (this->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)psVar1 - (long)psVar6;
  if (lVar5 == 0x10) {
    peVar2 = (psVar6->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    iVar3 = (*peVar2->_vptr_QueryCondition[4])(peVar2,cqb,(ulong)isRoot);
    return iVar3;
  }
  if (psVar6 == psVar1) {
    internal::throwIllegalStateException("State condition failed: ","!conditions_.empty()");
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_48,lVar5 >> 4);
  psVar1 = (this->conditions_).
           super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->conditions_).
                super__Vector_base<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->
             super___shared_ptr<obx::(anonymous_namespace)::QueryCondition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    local_4c = (*peVar2->_vptr_QueryCondition[4])(peVar2,cqb,0);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
  }
  if ((!isRoot) || (oVar4 = 0, (this->isOr_ & 1U) != 0)) {
    if ((this->isOr_ & 1U) == 0) {
      oVar4 = obx_qb_all(cqb,local_48._M_impl.super__Vector_impl_data._M_start,
                         (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
    }
    else {
      oVar4 = obx_qb_any(cqb);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return oVar4;
}

Assistant:

obx_qb_cond applyTo(OBX_query_builder* cqb, bool isRoot) const override {
        if (conditions_.size() == 1) return internalApplyCondition(*conditions_[0], cqb, isRoot);
        OBX_VERIFY_STATE(!conditions_.empty());

        std::vector<obx_qb_cond> cond_ids;
        cond_ids.reserve(conditions_.size());
        for (const std::shared_ptr<QueryCondition>& cond : conditions_) {
            cond_ids.emplace_back(internalApplyCondition(*cond, cqb, false));
        }
        if (isRoot && !isOr_) {
            // root All (AND) is implicit so no need to actually combine the conditions explicitly
            return 0;
        }

        if (isOr_) return obx_qb_any(cqb, cond_ids.data(), cond_ids.size());
        return obx_qb_all(cqb, cond_ids.data(), cond_ids.size());
    }